

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Query.cpp
# Opt level: O2

void __thiscall
adios2::query::QueryBase::ApplyOutputRegion
          (QueryBase *this,
          vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
          *touchedBlocks,Box<Dims> *referenceRegion)

{
  pointer puVar1;
  pointer puVar2;
  pointer ppVar3;
  pointer ppVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  unsigned_long uVar8;
  Dims diff;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_38;
  
  lVar5 = (long)(this->m_OutputRegion).first.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->m_OutputRegion).first.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (lVar5 != 0) {
    local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_38,lVar5 >> 3);
    puVar1 = (this->m_OutputRegion).first.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar5 = (long)(this->m_OutputRegion).first.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)puVar1 >> 3;
    puVar2 = (referenceRegion->first).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    bVar7 = false;
    for (lVar6 = 0; lVar5 != lVar6; lVar6 = lVar6 + 1) {
      uVar8 = puVar1[lVar6] - puVar2[lVar6];
      local_38._M_impl.super__Vector_impl_data._M_start[lVar6] = uVar8;
      bVar7 = (bool)(bVar7 | uVar8 != 0);
    }
    if (bVar7) {
      ppVar3 = (touchedBlocks->
               super__Vector_base<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (ppVar4 = (touchedBlocks->
                    super__Vector_base<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start; ppVar4 != ppVar3;
          ppVar4 = ppVar4 + 1) {
        for (lVar6 = 0; lVar5 != lVar6; lVar6 = lVar6 + 1) {
          puVar1 = (ppVar4->first).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                   ._M_impl.super__Vector_impl_data._M_start + lVar6;
          *puVar1 = *puVar1 + local_38._M_impl.super__Vector_impl_data._M_start[lVar6];
        }
      }
    }
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_38);
  }
  return;
}

Assistant:

void QueryBase::ApplyOutputRegion(std::vector<Box<Dims>> &touchedBlocks,
                                  const adios2::Box<Dims> &referenceRegion)
{
    if (m_OutputRegion.first.size() == 0)
        return;

    adios2::Dims diff;
    diff.resize(m_OutputRegion.first.size());
    bool isDifferent = false;
    for (size_t k = 0; k < m_OutputRegion.first.size(); k++)
    {
        diff[k] = m_OutputRegion.first[k] - referenceRegion.first[k];
        if (diff[k] != 0)
            isDifferent = true;
    }

    if (!isDifferent)
        return;

    // blocks are usually part of the reference region
    for (auto it = touchedBlocks.begin(); it != touchedBlocks.end(); it++)
    {
        for (size_t k = 0; k < m_OutputRegion.first.size(); k++)
            it->first[k] += diff[k];
    }
}